

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_cjson.c
# Opt level: O2

int lua_cjson_safe_new(lua_State *l)

{
  char *k;
  long lVar1;
  
  lua_cjson_new(l);
  lua_pushcclosure(l,lua_cjson_safe_new,0);
  lua_setfield(l,-2,"new");
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 8) {
    k = *(char **)((long)&DAT_001825c0 + lVar1);
    lua_getfield(l,-1,k);
    lua_pushcclosure(l,json_protect_conversion,1);
    lua_setfield(l,-2,k);
  }
  return 1;
}

Assistant:

static int lua_cjson_safe_new(lua_State *l)
{
    const char *func[] = { "decode", "encode", NULL };
    int i;

    lua_cjson_new(l);

    /* Fix new() method */
    lua_pushcfunction(l, lua_cjson_safe_new);
    lua_setfield(l, -2, "new");

    for (i = 0; func[i]; i++) {
        lua_getfield(l, -1, func[i]);
        lua_pushcclosure(l, json_protect_conversion, 1);
        lua_setfield(l, -2, func[i]);
    }

    return 1;
}